

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_undef(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  gen_exception(s,(s->base).pc_next,4);
  return;
}

Assistant:

DISAS_INSN(undef)
{
    /*
     * ??? This is both instructions that are as yet unimplemented
     * for the 680x0 series, as well as those that are implemented
     * but actually illegal for CPU32 or pre-68020.
     */
    //qemu_log_mask(LOG_UNIMP, "Illegal instruction: %04x @ %08x\n",
    //              insn, s->base.pc_next);
    gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
}